

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

_Bool square_remove_all_traps(chunk *c,loc grid)

{
  trap *ptVar1;
  trap *ptVar2;
  trap *p;
  _Bool _Var3;
  square *psVar4;
  trap_kind *ptVar5;
  
  psVar4 = square((chunk_conflict *)c,grid);
  ptVar1 = psVar4->trap;
  ptVar5 = (trap_kind *)lookup_trap("glyph of warding");
  p = ptVar1;
  while (p != (trap *)0x0) {
    ptVar2 = p->next;
    if (p->kind == ptVar5) {
      c->feeling_squares = c->feeling_squares - 0x100;
    }
    mem_free(p);
    p = ptVar2;
  }
  square_set_trap((chunk_conflict *)c,grid,(trap *)0x0);
  psVar4 = square((chunk_conflict *)c,grid);
  flag_off(psVar4->info,3,9);
  _Var3 = square_isseen((chunk_conflict *)c,grid);
  if (_Var3) {
    square_memorize_traps(c,grid);
    square_light_spot(c,grid);
  }
  return ptVar1 != (trap *)0x0;
}

Assistant:

bool square_remove_all_traps(struct chunk *c, struct loc grid)
{
	struct trap *trap = square(c, grid)->trap;
	struct trap_kind *rune = lookup_trap("glyph of warding");
	bool were_there_traps = trap == NULL ? false : true;

	while (trap) {
		struct trap *next_trap = trap->next;
		/* Keep count of glyphs of warding */
		if (trap->kind == rune) {
			c->feeling_squares -= (1 << 8);
		}
		mem_free(trap);
		trap = next_trap;
	}

	square_set_trap(c, grid, NULL);
	sqinfo_off(square(c, grid)->info, SQUARE_TRAP);

	/* Refresh grids that the character can see */
	if (square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return were_there_traps;
}